

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall soul::StructuralParser::parseEventFunction(StructuralParser *this)

{
  ModuleBase *pMVar1;
  Scope *pSVar2;
  SourceCodeText *o;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  Identifier IVar6;
  PoolItem *pPVar7;
  ConcreteType *pCVar8;
  PoolItem *pPVar9;
  Expression *pEVar10;
  Block *pBVar11;
  Context context;
  Context local_a0;
  Function *local_88;
  CompileMessage local_80;
  pool_ptr<soul::AST::Expression> local_48;
  pool_ptr<soul::AST::Expression> local_40;
  pool_ptr<soul::AST::Function> local_38;
  
  pMVar1 = (this->module).object;
  if (pMVar1 == (ModuleBase *)0x0) {
LAB_001e16eb:
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  iVar4 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[0xc])();
  if ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
       *)CONCAT44(extraout_var,iVar4) !=
      (vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
       *)0x0) {
    pMVar1 = (this->module).object;
    if (pMVar1 == (ModuleBase *)0x0) goto LAB_001e16eb;
    iVar5 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[4])();
    if ((char)iVar5 != '\0') goto LAB_001e13ab;
  }
  CompileMessageHelpers::createMessage<>
            (&local_80,syntax,error,"Event handlers can only be declared inside a processor");
  (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_80);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_80.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.description._M_dataplus._M_p != &local_80.description.field_2) {
    operator_delete(local_80.description._M_dataplus._M_p,
                    local_80.description.field_2._M_allocated_capacity + 1);
  }
LAB_001e13ab:
  local_80.description._M_dataplus._M_p =
       (pointer)(this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)local_80.description._M_dataplus._M_p != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_80.description._M_dataplus._M_p)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_80.description._M_dataplus._M_p)->super_RefCountedObject).
         refCount + 1;
  }
  local_80.description._M_string_length =
       (size_type)(this->super_SOULTokeniser).location.location.data;
  local_80.description.field_2._M_allocated_capacity = (size_type)this->currentScope;
  IVar6 = parseIdentifierWithMaxLength(this,0x80);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ebc);
  pPVar7 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0xe0);
  local_a0.location.sourceCode.object = (SourceCodeText *)&pPVar7->item;
  pPVar7->item = &PTR__ASTObject_002d4778;
  *(undefined4 *)&pPVar7->field_0x18 = 3;
  pPVar7[1].size = (size_t)local_80.description._M_dataplus._M_p;
  if ((SourceCodeText *)local_80.description._M_dataplus._M_p != (SourceCodeText *)0x0) {
    *(int *)local_80.description._M_dataplus._M_p =
         *(int *)local_80.description._M_dataplus._M_p + 1;
  }
  pPVar7[1].destructor = (DestructorFn *)local_80.description._M_string_length;
  pPVar7[1].item = (void *)local_80.description.field_2._M_allocated_capacity;
  pPVar7->item = &PTR__Function_002d5f18;
  *(undefined ***)&pPVar7[1].field_0x18 = &PTR__Function_002d5f58;
  pPVar7[2].size = 0;
  pPVar7[2].destructor = (DestructorFn *)0x0;
  pPVar7[2].item = (void *)0x0;
  *(undefined8 *)&pPVar7[2].field_0x18 = 0;
  pPVar7[3].destructor = (DestructorFn *)0x0;
  pPVar7[3].item = (void *)0x0;
  *(undefined8 *)&pPVar7[3].field_0x18 = 0;
  pPVar7[4].size = 0;
  pPVar7[4].destructor = (DestructorFn *)0x0;
  pPVar7[4].item = (void *)0x0;
  *(undefined8 *)&pPVar7[4].field_0x18 = 0;
  pPVar7[5].size = 0;
  pPVar7[5].destructor = (DestructorFn *)0x0;
  pPVar7[5].item = (void *)0x0;
  *(undefined8 *)&pPVar7[5].field_0x18 = 0;
  pPVar7[6].size = 0;
  pPVar7[6].destructor = (DestructorFn *)0x0;
  pPVar7[6].item = (void *)0x0;
  *(undefined8 *)((long)&pPVar7[6].item + 5) = 0;
  pPVar7[7].size = 0;
  pPVar7[7].destructor = (DestructorFn *)0x0;
  pPVar7->destructor =
       PoolAllocator::allocate<soul::AST::Function,_soul::AST::Context_&>::anon_class_1_0_00000001::
       __invoke;
  pSVar2 = this->currentScope;
  this->currentScope = (Scope *)&pPVar7[1].field_0x18;
  local_88 = (Function *)local_a0.location.sourceCode.object;
  std::
  vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>::
  emplace_back<soul::pool_ref<soul::AST::Function>>
            ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
              *)CONCAT44(extraout_var,iVar4),(pool_ref<soul::AST::Function> *)&local_a0);
  local_a0.location.sourceCode.object._0_4_ = 1;
  pCVar8 = PoolAllocator::
           allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::PrimitiveType::Primitive>
                     (&this->allocator->pool,(Context *)&local_80,(Primitive *)&local_a0);
  pPVar7[2].size = (size_t)pCVar8;
  pPVar7[2].destructor = (DestructorFn *)IVar6.name;
  if ((SourceCodeText *)local_80.description._M_dataplus._M_p != (SourceCodeText *)0x0) {
    *(int *)local_80.description._M_dataplus._M_p =
         *(int *)local_80.description._M_dataplus._M_p + 1;
  }
  o = (SourceCodeText *)pPVar7[2].item;
  pPVar7[2].item = local_80.description._M_dataplus._M_p;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  *(size_type *)&pPVar7[2].field_0x18 = local_80.description._M_string_length;
  pPVar7[3].size = local_80.description.field_2._M_allocated_capacity;
  pPVar7[6].field_0x1c = 1;
  local_40.object = parseType(this,functionParameter);
  local_a0.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_a0.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_a0.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_a0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_a0.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_a0.parentScope = this->currentScope;
  pPVar9 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x78);
  local_48.object = (Expression *)0x0;
  AST::VariableDeclaration::VariableDeclaration
            ((VariableDeclaration *)&pPVar9->item,&local_a0,&local_40,&local_48,false);
  pPVar9->destructor =
       PoolAllocator::
       allocate<soul::AST::VariableDeclaration,_soul::AST::Context,_soul::AST::Expression_&,_std::nullptr_t,_bool>
       ::anon_class_1_0_00000001::__invoke;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.location.sourceCode.object);
  local_a0.location.sourceCode.object = (SourceCodeText *)&pPVar9->item;
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
            ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
              *)&pPVar7[3].destructor,(pool_ref<soul::AST::VariableDeclaration> *)&local_a0);
  *(undefined1 *)&pPVar9[3].destructor = 1;
  IVar6 = parseIdentifier(this);
  *(string **)&pPVar9[1].field_0x18 = IVar6.name;
  bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x26375e);
  if (bVar3) {
    pEVar10 = parseType(this,functionParameter);
    local_a0.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (local_a0.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_a0.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_a0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_a0.location.location.data = (this->super_SOULTokeniser).location.location.data;
    local_a0.parentScope = this->currentScope;
    pPVar9 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x78);
    local_48.object = (Expression *)0x0;
    local_40.object = pEVar10;
    AST::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)&pPVar9->item,&local_a0,&local_40,&local_48,false);
    pPVar9->destructor =
         PoolAllocator::
         allocate<soul::AST::VariableDeclaration,_soul::AST::Context,_soul::AST::Expression_&,_std::nullptr_t,_bool>
         ::anon_class_1_0_00000001::__invoke;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.location.sourceCode.object);
    local_a0.location.sourceCode.object = (SourceCodeText *)&pPVar9->item;
    std::
    vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
              ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
                *)&pPVar7[3].destructor,(pool_ref<soul::AST::VariableDeclaration> *)&local_a0);
    *(undefined1 *)&pPVar9[3].destructor = 1;
    IVar6 = parseIdentifier(this);
    *(string **)&pPVar9[1].field_0x18 = IVar6.name;
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x286aae);
  local_38.object = local_88;
  pBVar11 = parseBracedBlock(this,&local_38);
  pPVar7[7].size = (size_t)pBVar11;
  this->currentScope = pSVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull
            ((SourceCodeText *)local_80.description._M_dataplus._M_p);
  return;
}

Assistant:

void parseEventFunction()
    {
        auto functions = module->getFunctionList();

        if (functions == nullptr || ! module->isProcessor())
            throwError (Errors::noEventFunctionsAllowed());

        auto context = getContext();
        auto name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        expect (Operator::openParen);
        auto& f = allocate<AST::Function> (context);
        ScopedScope scope (*this, f);

        functions->push_back (f);
        f.returnType = allocate<AST::ConcreteType> (context, PrimitiveType::void_);
        f.name = name;
        f.nameLocation = context;
        f.eventFunction = true;

        // Event functions have either 1 argument (the type of the event) or two arguments
        // (an index followed by the type of the event) if the input is an event array

        {
            auto& type = parseType (ParseTypeContext::functionParameter);
            auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
            f.parameters.push_back (v);
            v.isFunctionParameter = true;
            v.name = parseIdentifier();
        }

        if (matchIf (Operator::comma))
        {
            auto& type = parseType (ParseTypeContext::functionParameter);
            auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
            f.parameters.push_back (v);
            v.isFunctionParameter = true;
            v.name = parseIdentifier();
        }

        expect (Operator::closeParen);
        f.block = parseBracedBlock (f);
    }